

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::FastSS2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  ushort *puVar4;
  ulong hasbits_00;
  undefined8 *puVar5;
  ulong uVar6;
  char *pcVar7;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 arena;
  ParseContext *ctx_00;
  ParseContext *ctx_01;
  uint *puVar8;
  
  if (data.field_0._0_2_ != 0) {
    pcVar7 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar7;
  }
  ctx_01 = (ParseContext *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)ctx_01 & 7) == 0) {
    arena = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(msg->_internal_metadata_).ptr_;
    if ((arena.data & 1) != 0) {
      arena = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
              ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(arena.data & 0xfffffffffffffffe))->data
      ;
    }
    uVar1 = *(ushort *)ptr;
    if ((Arena *)arena.data == (Arena *)0x0) {
      puVar4 = (ushort *)
               anon_unknown_105::ReadStringNoArena
                         ((MessageLite *)(ptr + 2),(char *)ctx,ctx_01,0,table,
                          (ArenaStringPtr *)hasbits);
    }
    else {
      puVar4 = (ushort *)
               EpsCopyInputStream::ReadArenaString
                         (&ctx->super_EpsCopyInputStream,ptr + 2,(ArenaStringPtr *)ctx_01,
                          (Arena *)arena);
    }
    hasbits_00 = hasbits | 1L << ((ulong)data.field_0 >> 0x10 & 0x3f);
    if (puVar4 != (ushort *)0x0) {
      puVar5 = (undefined8 *)
               ((ulong)(ctx_01->super_EpsCopyInputStream).limit_end_ & 0xfffffffffffffffc);
      iVar2 = utf8_range_IsValid((char *)*puVar5,puVar5[1]);
      if (iVar2 == 0) {
        ReportFastUtf8Error((int)(char)uVar1 + (uint)uVar1 >> 1,table);
      }
      if (puVar4 < (ctx->super_EpsCopyInputStream).limit_end_) {
        uVar3 = (uint)table->fast_idx_mask & (uint)*puVar4;
        if ((uVar3 & 7) == 0) {
          uVar6 = (ulong)(uVar3 & 0xfffffff8);
          pcVar7 = (char *)(**(code **)(&table[1].has_bits_offset + uVar6))
                                     (msg,puVar4,ctx,
                                      (ulong)*puVar4 ^
                                      *(ulong *)(&table[1].fast_idx_mask + uVar6 * 2),table,
                                      hasbits_00);
          return pcVar7;
        }
        protobuf_assumption_failed
                  ("(idx & 7) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                   ,0x452);
      }
      if ((ulong)table->has_bits_offset != 0) {
        puVar8 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
        if (((ulong)puVar8 & 3) != 0) {
          AlignFail(puVar8);
        }
        *puVar8 = *puVar8 | (uint)hasbits_00;
      }
      return (char *)puVar4;
    }
    anon_unknown_105::EnsureArenaStringIsNotDefault(msg,(ArenaStringPtr *)ctx_01);
    pcVar7 = Error(msg,(char *)ctx_01,ctx_00,(TcFieldData)arena,table,hasbits_00);
    return pcVar7;
  }
  AlignFail(ctx_01);
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastSS2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularString<uint16_t, ArenaStringPtr,
                                          kUtf8ValidateOnly>(
      PROTOBUF_TC_PARAM_PASS);
}